

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

void phosg::print_data(FILE *stream,void *data,uint64_t size,uint64_t start_address,void *prev,
                      uint64_t flags)

{
  iovec *prev_iovs;
  iovec iov;
  iovec prev_iov;
  iovec local_20;
  iovec local_10;
  
  if (prev == (void *)0x0) {
    prev_iovs = (iovec *)0x0;
  }
  else {
    prev_iovs = &local_10;
    local_10.iov_base = prev;
    local_10.iov_len = size;
  }
  local_20.iov_base = data;
  local_20.iov_len = size;
  print_data(stream,&local_20,1,start_address,prev_iovs,(ulong)(prev != (void *)0x0),flags);
  return;
}

Assistant:

void print_data(FILE* stream, const void* data, uint64_t size,
    uint64_t start_address, const void* prev, uint64_t flags) {
  iovec iov;
  iov.iov_base = const_cast<void*>(data);
  iov.iov_len = size;
  if (prev) {
    iovec prev_iov;
    prev_iov.iov_base = const_cast<void*>(prev);
    prev_iov.iov_len = size;
    print_data(stream, &iov, 1, start_address, &prev_iov, 1, flags);
  } else {
    print_data(stream, &iov, 1, start_address, nullptr, 0, flags);
  }
}